

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

LogStream * __thiscall LogStream::operator<<(LogStream *this,short v)

{
  undefined2 in_SI;
  LogStream *in_RDI;
  undefined6 in_stack_fffffffffffffff0;
  
  operator<<((LogStream *)CONCAT26(in_SI,in_stack_fffffffffffffff0),(int)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

LogStream& LogStream::operator<<(short v){
    *this << static_cast<int>(v);
    return *this;
}